

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_get_object_by_id(qpdf_data qpdf,int objid,int generation)

{
  qpdf_data qpdf_00;
  qpdf_oh qVar1;
  element_type *peVar2;
  QPDFObjectHandle local_28;
  int local_18;
  int local_14;
  int generation_local;
  int objid_local;
  qpdf_data qpdf_local;
  
  local_18 = generation;
  local_14 = objid;
  _generation_local = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_get_object_by_id",0);
  qpdf_00 = _generation_local;
  peVar2 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      _generation_local);
  QPDF::getObjectByID((QPDF *)&local_28,(int)peVar2,local_14);
  qVar1 = new_object(qpdf_00,&local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_28);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_get_object_by_id(qpdf_data qpdf, int objid, int generation)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_get_object_by_id");
    return new_object(qpdf, qpdf->qpdf->getObjectByID(objid, generation));
}